

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

StringRef llvm::dwarf::ChildrenString(uint Children)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  if (Children == 1) {
    sVar2 = 0xf;
    pcVar1 = "DW_CHILDREN_yes";
  }
  else {
    pcVar1 = (char *)0x0;
    sVar2 = 0;
    if (Children == 0) {
      sVar2 = 0xe;
      pcVar1 = "DW_CHILDREN_no";
    }
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::ChildrenString(unsigned Children) {
  switch (Children) {
  case DW_CHILDREN_no:
    return "DW_CHILDREN_no";
  case DW_CHILDREN_yes:
    return "DW_CHILDREN_yes";
  }
  return StringRef();
}